

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O0

uint32_t WriteBinaryMaterialProperty(aiMaterialProperty *prop)

{
  uint32_t uVar1;
  size_t sVar2;
  aiPropertyTypeInfo local_1c;
  uint32_t local_18;
  uint32_t local_14;
  uint32_t old;
  uint32_t len;
  aiMaterialProperty *prop_local;
  
  local_14 = 0;
  _old = prop;
  local_18 = WriteMagic(0x123e);
  uVar1 = Write<aiString>(&_old->mKey);
  local_14 = uVar1 + local_14;
  uVar1 = Write<unsigned_int>(&_old->mSemantic);
  local_14 = uVar1 + local_14;
  uVar1 = Write<unsigned_int>(&_old->mIndex);
  local_14 = uVar1 + local_14;
  uVar1 = Write<unsigned_int>(&_old->mDataLength);
  local_14 = uVar1 + local_14;
  local_1c = _old->mType;
  uVar1 = Write<unsigned_int>(&local_1c);
  local_14 = uVar1 + local_14;
  sVar2 = fwrite(_old->mData,1,(ulong)_old->mDataLength,(FILE *)out);
  local_14 = (int)sVar2 + local_14;
  ChangeInteger(local_18,local_14);
  return local_14;
}

Assistant:

uint32_t WriteBinaryMaterialProperty(const aiMaterialProperty* prop)
{
	uint32_t len = 0, old = WriteMagic(ASSBIN_CHUNK_AIMATERIALPROPERTY);

	len += Write<aiString>(prop->mKey);
	len += Write<unsigned int>(prop->mSemantic);
	len += Write<unsigned int>(prop->mIndex);

	len += Write<unsigned int>(prop->mDataLength);
	len += Write<unsigned int>((unsigned int)prop->mType);
	len += static_cast<uint32_t>(fwrite(prop->mData,1,prop->mDataLength,out));

	ChangeInteger(old,len);
	return len;
}